

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_annotator.cpp
# Opt level: O3

BinarySection *
flatbuffers::anon_unknown_49::MakeBinarySection
          (BinarySection *__return_storage_ptr__,string *name,BinarySectionType type,
          vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_> *regions)

{
  pointer pBVar1;
  pointer pBVar2;
  BinarySection *extraout_RAX;
  vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_> local_38;
  
  (__return_storage_ptr__->name)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->name).field_2
  ;
  (__return_storage_ptr__->name)._M_string_length = 0;
  (__return_storage_ptr__->name).field_2._M_local_buf[0] = '\0';
  __return_storage_ptr__->type = Unknown;
  (__return_storage_ptr__->regions).
  super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->regions).
  super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->regions).
  super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  __return_storage_ptr__->type = type;
  local_38.super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (__return_storage_ptr__->regions).
       super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  pBVar1 = (regions->
           super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pBVar2 = (regions->
           super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->regions).
  super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (regions->
       super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>).
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_38.super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (__return_storage_ptr__->regions).
       super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_38.super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (__return_storage_ptr__->regions).
       super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->regions).
  super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>._M_impl.
  super__Vector_impl_data._M_start = pBVar1;
  (__return_storage_ptr__->regions).
  super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>._M_impl.
  super__Vector_impl_data._M_finish = pBVar2;
  (regions->
  super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>)._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (regions->
  super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>)._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (regions->
  super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>)._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::~vector
            (&local_38);
  return extraout_RAX;
}

Assistant:

static BinarySection MakeBinarySection(const std::string &name,
                                       const BinarySectionType type,
                                       std::vector<BinaryRegion> regions) {
  BinarySection section;
  section.name = name;
  section.type = type;
  section.regions = std::move(regions);
  return section;
}